

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# insertion-sort.c
# Opt level: O2

void insertion_sort(int *array,size_t length)

{
  int iVar1;
  void *__ptr;
  size_t n;
  size_t sVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  
  __ptr = malloc(length * 4);
  for (sVar2 = 0; length != sVar2; sVar2 = sVar2 + 1) {
    *(int *)((long)__ptr + sVar2 * 4) = array[sVar2];
  }
  uVar3 = 1;
  uVar5 = uVar3;
  do {
    if (length <= uVar3) {
      free(__ptr);
      return;
    }
    iVar1 = *(int *)((long)__ptr + uVar3 * 4);
    for (uVar6 = 0; uVar5 != uVar6; uVar6 = uVar6 + 1) {
      if (iVar1 <= array[uVar6]) {
        for (uVar4 = uVar5 + 1; uVar6 < uVar4; uVar4 = uVar4 - 1) {
          array[uVar4] = array[uVar4 - 1];
        }
        array[uVar6] = iVar1;
        goto LAB_00101234;
      }
    }
    array[uVar5] = iVar1;
LAB_00101234:
    uVar5 = uVar5 + 1;
    uVar3 = uVar3 + 1;
  } while( true );
}

Assistant:

void insertion_sort(int* array, const size_t length) {
  int* buffer = (int*)malloc(length * sizeof(int));
  size_t target_len = 1; // populated by the first element, already present
  for (size_t n = 0; n < length; n++) {
    buffer[n] = array[n];
  }
  for (size_t buffer_pos = 1; buffer_pos < length; buffer_pos++) {
    int current = buffer[buffer_pos];
    bool inserted = false;
    for (size_t n = 0; n < target_len; n++) {
      if (array[n] >= current) {
        // shift and insert
        for (size_t o = target_len + 1; o > n; o--) {
          array[o] = array[o - 1];
        }
        array[n] = current;
        target_len++;
        inserted = true;
        break;
      }
    }
    if (!inserted) {
      // push at the end
      array[target_len] = current;
      target_len++;
    }
  }
  free(buffer);
}